

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

void flow_cutter::DistanceAwareCutter::
     compute_hop_distance_from<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>>
               (Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
                *graph,TemporaryData *tmp,int source,ArrayIDFunc<int> *dist)

{
  int *piVar1;
  ArrayIDFunc<int> *in_RCX;
  int in_EDX;
  anon_class_1_0_00000001 on_new_arc;
  anon_class_16_2_f6f92433 should_follow_arc;
  anon_class_1_0_00000001 see_node;
  anon_class_1_0_00000001 was_node_seen;
  undefined4 in_stack_00000040;
  Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
  *in_stack_00000058;
  BreadthFirstSearch *in_stack_00000060;
  anon_class_16_2_f6f92433 *in_stack_00000070;
  anon_class_1_0_00000001 *in_stack_00000078;
  int *in_stack_ffffffffffffffa8;
  ArrayIDFunc<int> *in_stack_ffffffffffffffb0;
  
  std::numeric_limits<int>::max();
  ArrayIDFunc<int>::fill(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  piVar1 = ArrayIDFunc<int>::operator[](in_RCX,in_EDX);
  *piVar1 = 0;
  BreadthFirstSearch::operator()
            (in_stack_00000060,in_stack_00000058,(TemporaryData *)graph,tmp._4_4_,
             (anon_class_1_0_00000001 *)CONCAT44(source,in_stack_00000040),
             (anon_class_1_0_00000001 *)dist,in_stack_00000070,in_stack_00000078);
  return;
}

Assistant:

static void compute_hop_distance_from(const Graph& graph, TemporaryData& tmp,
        int source, ArrayIDFunc<int>& dist)
    {
        dist.fill(std::numeric_limits<int>::max());
        dist[source] = 0;

        auto was_node_seen = [&](int x) { return false; };
        auto see_node = [](int x) { return true; };
        auto should_follow_arc = [&](int xy) {
            if (dist(graph.tail(xy)) < dist(graph.head(xy)) - 1) {
                dist[graph.head(xy)] = dist(graph.tail(xy)) + 1;
                return true;
            } else {
                return false;
            }
        };
        auto on_new_arc = [&](int xy) {};
        BreadthFirstSearch()(graph, tmp, source, was_node_seen, see_node,
            should_follow_arc, on_new_arc);
    }